

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateData.cpp
# Opt level: O2

void __thiscall
amrex::StateData::restart
          (StateData *this,istream *is,Box *p_domain,BoxArray *grds,DistributionMapping *dm,
          FabFactory<amrex::FArrayBox> *factory,StateDescriptor *d,string *chkfile)

{
  _Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false> _Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  IndexType typ;
  _Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false> _Var5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  BoxArray grids_in;
  Box domain_in;
  undefined4 extraout_var;
  
  this->desc = d;
  this->arena = (Arena *)0x0;
  uVar2 = *(undefined8 *)((p_domain->smallend).vect + 2);
  uVar3 = *(undefined8 *)(p_domain->bigend).vect;
  uVar4 = *(undefined8 *)((p_domain->bigend).vect + 2);
  *(undefined8 *)(this->domain).smallend.vect = *(undefined8 *)(p_domain->smallend).vect;
  *(undefined8 *)((this->domain).smallend.vect + 2) = uVar2;
  *(undefined8 *)(this->domain).bigend.vect = uVar3;
  *(undefined8 *)((this->domain).bigend.vect + 2) = uVar4;
  BoxArray::operator=(&this->grids,grds);
  std::__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2> *)
             &this->dmap,
             (__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2> *)dm);
  _Var5._M_head_impl._0_4_ = (*factory->_vptr_FabFactory[5])(factory);
  _Var5._M_head_impl._4_4_ = extraout_var;
  _Var1._M_head_impl =
       (this->m_factory)._M_t.
       super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
       .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl;
  (this->m_factory)._M_t.
  super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
  .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl =
       _Var5._M_head_impl;
  if (_Var1._M_head_impl != (FabFactory<amrex::FArrayBox> *)0x0) {
    (*(_Var1._M_head_impl)->_vptr_FabFactory[1])();
  }
  typ = StateDescriptor::getType(this->desc);
  if (typ.itype != 0) {
    for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
      uVar8 = 1 << ((byte)lVar7 & 0x1f);
      uVar6 = (uint)lVar7;
      (this->domain).bigend.vect[lVar7] =
           ((this->domain).bigend.vect[lVar7] + (uint)((typ.itype >> (uVar6 & 0x1f) & 1) != 0)) -
           (uint)(((this->domain).btype.itype >> (uVar6 & 0x1f) & 1) != 0);
      if ((typ.itype >> (uVar6 & 0x1f) & 1) == 0) {
        uVar8 = ~uVar8 & (this->domain).btype.itype;
      }
      else {
        uVar8 = uVar8 | (this->domain).btype.itype;
      }
      (this->domain).btype.itype = uVar8;
    }
    BoxArray::convert(&this->grids,typ);
  }
  domain_in.smallend.vect[0] = 1;
  domain_in.smallend.vect[1] = 1;
  domain_in.smallend.vect[2] = 1;
  domain_in.bigend.vect[0] = 0;
  domain_in.bigend.vect[1] = 0;
  domain_in.bigend.vect[2] = 0;
  domain_in.btype.itype = 0;
  BoxArray::BoxArray(&grids_in);
  amrex::operator>>(is,&domain_in);
  BoxArray::readFrom(&grids_in,is);
  BoxArray::~BoxArray(&grids_in);
  restartDoit(this,is,chkfile);
  return;
}

Assistant:

void
StateData::restart (std::istream&          is,
                    const Box&             p_domain,
                    const BoxArray&        grds,
                    const DistributionMapping& dm,
                    const FabFactory<FArrayBox>& factory,
                    const StateDescriptor& d,
                    const std::string&     chkfile)
{
    desc = &d;
    arena = nullptr;
    domain = p_domain;
    grids = grds;
    dmap = dm;
    m_factory.reset(factory.clone());

    // Convert to proper type.
    IndexType typ(desc->getType());
    if (!typ.cellCentered()) {
        domain.convert(typ);
        grids.convert(typ);
    }

    {
        Box domain_in;
        BoxArray grids_in;
        is >> domain_in;
        grids_in.readFrom(is);
        BL_ASSERT(domain_in == domain);
        BL_ASSERT(amrex::match(grids_in,grids));
    }

    restartDoit(is, chkfile);
}